

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyNormalizeSpaces(Lexer *lexer,Node *node)

{
  byte bVar1;
  Bool BVar2;
  uint uVar3;
  tmbstr ptVar4;
  tmbstr buf;
  int iVar5;
  ulong uVar6;
  uint c;
  uint local_2c;
  
  if (node != (Node *)0x0) {
    do {
      if (node->content != (Node *)0x0) {
        prvTidyNormalizeSpaces(lexer,node->content);
      }
      BVar2 = prvTidynodeIsText(node);
      if (BVar2 != no) {
        ptVar4 = lexer->lexbuf;
        uVar6 = (ulong)node->start;
        buf = ptVar4 + uVar6;
        if (node->start < node->end) {
          do {
            iVar5 = (int)uVar6;
            bVar1 = lexer->lexbuf[uVar6];
            local_2c = (uint)bVar1;
            if ((char)bVar1 < '\0') {
              uVar3 = prvTidyGetUTF8(lexer->lexbuf + uVar6,&local_2c);
              iVar5 = iVar5 + uVar3;
            }
            if (local_2c == 0xa0) {
              local_2c = 0x20;
            }
            buf = prvTidyPutUTF8(buf,local_2c);
            uVar6 = (ulong)(iVar5 + 1U);
          } while (iVar5 + 1U < node->end);
          ptVar4 = lexer->lexbuf;
        }
        node->end = (int)buf - (int)ptVar4;
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(NormalizeSpaces)(Lexer *lexer, Node *node)
{
    while ( node )
    {
        if ( node->content )
            TY_(NormalizeSpaces)( lexer, node->content );

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (byte) lexer->lexbuf[i];

                /* look for UTF-8 multibyte character */
                if ( c > 0x7F )
                    i += TY_(GetUTF8)( lexer->lexbuf + i, &c );

                if ( c == 160 )
                    c = ' ';

                p = TY_(PutUTF8)(p, c);
            }
            node->end = p - lexer->lexbuf;
        }

        node = node->next;
    }
}